

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O0

result<double,_toml::error_info> * toml::read_hex_float(string *str,source_location *src,double val)

{
  int iVar1;
  char *pcVar2;
  string *in_RDX;
  source_location *in_RDI;
  source_location *in_XMM0_Qa;
  success<double> s;
  int res;
  double *in_stack_fffffffffffffe18;
  failure_type *f;
  source_location *this;
  source_location *this_00;
  allocator<char> *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  error_info *in_stack_fffffffffffffe78;
  allocator<char> local_f9 [121];
  failure_type local_80;
  undefined4 in_stack_ffffffffffffffd8;
  
  this_00 = in_RDI;
  pcVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6f8e97);
  iVar1 = __isoc99_sscanf(pcVar2,"%la",&stack0xffffffffffffffe0);
  if (iVar1 == 1) {
    s = ok<double&>(in_stack_fffffffffffffe18);
    result<double,_toml::error_info>::result
              ((result<double,_toml::error_info> *)in_RDI,(success_type)s.value);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    source_location::source_location(this_00,in_RDI);
    this = (source_location *)&stack0xfffffffffffffe57;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    make_error_info<>(in_RDX,in_XMM0_Qa,(string *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
    f = &local_80;
    err<toml::error_info>(in_stack_fffffffffffffe78);
    result<double,_toml::error_info>::result((result<double,_toml::error_info> *)this,f);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6f8f81);
    error_info::~error_info((error_info *)this);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe57);
    source_location::~source_location(this);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    std::allocator<char>::~allocator(local_f9);
  }
  return (result<double,_toml::error_info> *)this_00;
}

Assistant:

inline result<double, error_info>
read_hex_float(const std::string& str, const source_location src, double val)
{
#if defined(_MSC_VER) && ! defined(__clang__)
    const auto res = ::sscanf_s(str.c_str(), "%la", std::addressof(val));
#else
    const auto res = std::sscanf(str.c_str(), "%la", std::addressof(val));
#endif
    if(res != 1)
    {
        return err(make_error_info("toml::parse_floating: "
            "failed to read hexadecimal floating point value ",
            std::move(src), "here"));
    }
    return ok(val);
}